

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.h
# Opt level: O0

void tf_dealloc_data(TemporalFilterData *tf_data,int is_high_bitdepth)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI != 0) {
    *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) << 1;
  }
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x10) = 0;
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x18) = 0;
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x20) = 0;
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x28) = 0;
  return;
}

Assistant:

static inline void tf_dealloc_data(TemporalFilterData *tf_data,
                                   int is_high_bitdepth) {
  if (is_high_bitdepth)
    tf_data->pred = (uint8_t *)CONVERT_TO_SHORTPTR(tf_data->pred);
  aom_free(tf_data->tmp_mbmi);
  tf_data->tmp_mbmi = NULL;
  aom_free(tf_data->accum);
  tf_data->accum = NULL;
  aom_free(tf_data->count);
  tf_data->count = NULL;
  aom_free(tf_data->pred);
  tf_data->pred = NULL;
}